

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderRenderingLinesCase::setUniformsBeforeDrawCall
          (GeometryShaderRenderingLinesCase *this,_draw_call_type drawcall_type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  TestError *this_00;
  bool bVar7;
  long lVar6;
  
  iVar1 = (*((this->super_GeometryShaderRenderingCase).m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  lVar6 = CONCAT44(extraout_var,iVar1);
  iVar1 = (**(code **)(lVar6 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_gl_line_loop_draw_call");
  iVar2 = (**(code **)(lVar6 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,
                     "is_gl_line_strip_adjacency_draw_call");
  iVar3 = (**(code **)(lVar6 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,
                     "is_gl_lines_adjacency_draw_call");
  iVar4 = (**(code **)(lVar6 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_gl_lines_draw_call");
  iVar5 = (**(code **)(lVar6 + 0xb48))((this->super_GeometryShaderRenderingCase).m_po_id);
  if (iVar1 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"is_gl_line_loop_draw_call_uniform_location != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0xd19);
  }
  else if (iVar2 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"is_gl_line_strip_adjacency_draw_call_uniform_location != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0xd1a);
  }
  else if (iVar3 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"is_gl_lines_adjacency_draw_call_uniform_location != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0xd1b);
  }
  else if (iVar4 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"is_gl_lines_draw_call_uniform_location != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0xd1c);
  }
  else {
    if (iVar5 != -1) {
      bVar7 = drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS ||
              (drawcall_type & ~DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED) ==
              DRAW_CALL_TYPE_GL_DRAW_ELEMENTS;
      (**(code **)(lVar6 + 0x14f0))(iVar5,bVar7,bVar7);
      (**(code **)(lVar6 + 0x14f0))(iVar1,this->m_drawcall_mode == 2);
      (**(code **)(lVar6 + 0x14f0))(iVar2,this->m_drawcall_mode == 0xb);
      (**(code **)(lVar6 + 0x14f0))(iVar3,this->m_drawcall_mode == 10);
      (**(code **)(lVar6 + 0x14f0))(iVar4,this->m_drawcall_mode == 1);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"is_indexed_draw_call_uniform_location != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0xd1d);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderRenderingLinesCase::setUniformsBeforeDrawCall(_draw_call_type drawcall_type)
{
	const glw::Functions& gl							  = m_context.getRenderContext().getFunctions();
	glw::GLint is_gl_line_loop_draw_call_uniform_location = gl.getUniformLocation(m_po_id, "is_gl_line_loop_draw_call");
	glw::GLint is_gl_line_strip_adjacency_draw_call_uniform_location =
		gl.getUniformLocation(m_po_id, "is_gl_line_strip_adjacency_draw_call");
	glw::GLint is_gl_lines_adjacency_draw_call_uniform_location =
		gl.getUniformLocation(m_po_id, "is_gl_lines_adjacency_draw_call");
	glw::GLint is_gl_lines_draw_call_uniform_location = gl.getUniformLocation(m_po_id, "is_gl_lines_draw_call");
	glw::GLint is_indexed_draw_call_uniform_location  = gl.getUniformLocation(m_po_id, "is_indexed_draw_call");

	TCU_CHECK(is_gl_line_loop_draw_call_uniform_location != -1);
	TCU_CHECK(is_gl_line_strip_adjacency_draw_call_uniform_location != -1);
	TCU_CHECK(is_gl_lines_adjacency_draw_call_uniform_location != -1);
	TCU_CHECK(is_gl_lines_draw_call_uniform_location != -1);
	TCU_CHECK(is_indexed_draw_call_uniform_location != -1);

	gl.uniform1i(is_indexed_draw_call_uniform_location, (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS ||
														 drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED ||
														 drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS));
	gl.uniform1i(is_gl_line_loop_draw_call_uniform_location, (m_drawcall_mode == GL_LINE_LOOP));
	gl.uniform1i(is_gl_line_strip_adjacency_draw_call_uniform_location,
				 (m_drawcall_mode == GL_LINE_STRIP_ADJACENCY_EXT));
	gl.uniform1i(is_gl_lines_adjacency_draw_call_uniform_location, (m_drawcall_mode == GL_LINES_ADJACENCY_EXT));
	gl.uniform1i(is_gl_lines_draw_call_uniform_location, (m_drawcall_mode == GL_LINES));
}